

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall QByteArray::detach(QByteArray *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    return;
  }
  reallocData(this,(this->d).size,KeepSize);
  return;
}

Assistant:

bool needsDetach() const noexcept { return !d || d->needsDetach(); }